

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall Centaurus::NFA<char>::NFA(NFA<char> *this)

{
  CharClass<char> local_30;
  
  (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFABase_0019f1b0;
  std::
  vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>::
  emplace_back<>(&(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states);
  local_30._vptr_CharClass = (_func_int **)&PTR__CharClass_0019f040;
  local_30.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_30.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  add_state(this,&local_30);
  CharClass<char>::~CharClass(&local_30);
  return;
}

Assistant:

NFA()
    {
        m_states.emplace_back();
        add_state(CharClass<TCHAR>());
    }